

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_g16q(Pixel *out,Pixel *in,Background *back)

{
  uint uVar1;
  double dVar2;
  
  dVar2 = floor((double)in->b * 0.0722 + (double)in->r * 0.2126 + (double)in->g * 0.7152 + 0.5);
  uVar1 = (int)dVar2 & 0xffff;
  out->b = uVar1;
  out->g = uVar1;
  out->r = uVar1;
  out->a = in->a;
  return;
}

Assistant:

static void
gpc_g16q(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;
   out->r = out->g = out->b = u16d(YfromRGBint(in->r, in->g, in->b));
   out->a = in->a;
}